

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::ImageStoreTestInstance::commandBeforeCompute
          (ImageStoreTestInstance *this,VkCommandBuffer cmdBuffer)

{
  VkImageSubresourceRange subresourceRange;
  deUint32 layerCount;
  int iVar1;
  DeviceInterface *pDVar2;
  Image *this_00;
  VkImage *pVVar3;
  Buffer *this_01;
  VkBuffer *pVVar4;
  undefined1 local_e0 [8];
  VkBufferMemoryBarrier writeConstantsBarrier;
  VkDeviceSize constantsBufferSize;
  undefined1 local_80 [8];
  VkImageMemoryBarrier setImageLayoutBarrier;
  undefined4 uStack_30;
  VkImageSubresourceRange fullImageSubresourceRange;
  DeviceInterface *vk;
  VkCommandBuffer cmdBuffer_local;
  ImageStoreTestInstance *this_local;
  
  pDVar2 = Context::getDeviceInterface
                     ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                      m_context);
  layerCount = Texture::numLayers(&(this->super_StoreTestInstance).super_BaseTestInstance.m_texture)
  ;
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)&setImageLayoutBarrier.field_0x44,1,0,1,0,layerCount);
  this_00 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            operator->(&(this->m_image).
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>)
  ;
  pVVar3 = image::Image::get(this_00);
  subresourceRange.levelCount = fullImageSubresourceRange.aspectMask;
  subresourceRange.aspectMask = setImageLayoutBarrier._68_4_;
  subresourceRange.baseMipLevel = uStack_30;
  subresourceRange.baseArrayLayer = fullImageSubresourceRange.baseMipLevel;
  subresourceRange.layerCount = fullImageSubresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_80,0,0,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)pVVar3->m_internal,subresourceRange);
  iVar1 = Texture::numLayers(&(this->super_StoreTestInstance).super_BaseTestInstance.m_texture);
  writeConstantsBarrier.size = (long)iVar1 * this->m_constantsBufferChunkSizeBytes;
  this_01 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->(&(this->m_constantsBuffer).
                        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                      );
  pVVar4 = image::Buffer::get(this_01);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_e0,0x4000,0x20,(VkBuffer)pVVar4->m_internal,0,
             writeConstantsBarrier.size);
  (*pDVar2->_vptr_DeviceInterface[0x6d])(pDVar2,cmdBuffer,1,0x800,0,0,0,1,(int)local_e0,1,local_80);
  return;
}

Assistant:

void ImageStoreTestInstance::commandBeforeCompute (const VkCommandBuffer cmdBuffer)
{
	const DeviceInterface& vk = m_context.getDeviceInterface();

	const VkImageSubresourceRange fullImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, m_texture.numLayers());
	const VkImageMemoryBarrier setImageLayoutBarrier = makeImageMemoryBarrier(
		0u, 0u,
		VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
		m_image->get(), fullImageSubresourceRange);

	const VkDeviceSize constantsBufferSize = m_texture.numLayers() * m_constantsBufferChunkSizeBytes;
	const VkBufferMemoryBarrier writeConstantsBarrier = makeBufferMemoryBarrier(
		VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT,
		m_constantsBuffer->get(), 0ull, constantsBufferSize);

	vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &writeConstantsBarrier, 1, &setImageLayoutBarrier);
}